

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

void lj_func_closeuv(lua_State *L,TValue *level)

{
  uint uVar1;
  ulong in_RSI;
  long in_RDI;
  GCobj *o;
  global_State *g;
  GCupval *uv;
  global_State *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  global_State *g_00;
  global_State *local_18;
  
  uVar1 = *(uint *)(in_RDI + 8);
  while( true ) {
    uVar2 = false;
    if (*(int *)(in_RDI + 0x28) != 0) {
      local_18 = (global_State *)(ulong)*(uint *)(in_RDI + 0x28);
      uVar2 = in_RSI <= *(uint *)&local_18->allocf;
    }
    if ((bool)uVar2 == false) break;
    *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)&local_18->strhash;
    if ((*(byte *)((long)&local_18->strhash + 4) & (*(byte *)((ulong)uVar1 + 0x28) ^ 3) & 3) == 0) {
      g_00 = local_18;
      unlinkuv((GCupval *)local_18);
      lj_gc_closeuv(g_00,(GCupval *)CONCAT17(uVar2,in_stack_ffffffffffffffd0));
    }
    else {
      lj_func_freeuv(in_stack_ffffffffffffffc8,(GCupval *)0x10c68e);
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lua_assert(!isblack(o) && !uv->closed && uvval(uv) != &uv->tv);
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(uv);
      lj_gc_closeuv(g, uv);
    }
  }
}